

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

int test_main(ITesting *t)

{
  trun::Config::Instance();
  gnilk::Logger::SetAllSinkDebugLevel(kError);
  (*t->ModuleDepends)("mdepmodA","mdepmodB");
  (*t->ModuleDepends)("mdepmodB","mdepmodC,mdepmodD");
  return 0;
}

Assistant:

DLL_EXPORT int test_main(ITesting *t) {
    // Don't do anything - just call it - as it performs initialization on the logger and other things
    // otherwise it will be reinitialized later by functions under test
    Config::Instance();
    // Now set the log-level, we just want errors (this is for the library and not for the testrunner)
    gnilk::Logger::SetAllSinkDebugLevel(gnilk::LogLevel::kError);

    // Test the module dependency
    t->ModuleDepends("mdepmodA", "mdepmodB");
    t->ModuleDepends("mdepmodB", "mdepmodC,mdepmodD");

    return kTR_Pass;

    // FIXME: This doesn't work... (I've changed the config stuff)

    // Testing the v2 query-interface features
    ITestingConfig *tr_config = nullptr;
    t->QueryInterface(ITestingConfig_IFace_ID, (void **)&tr_config);
    TR_ASSERT(t, tr_config != nullptr);

    TRUN_ConfigItem configItems[10];

    size_t nMaxItems = tr_config->List(0, nullptr);
    TR_ASSERT(t, nMaxItems != 0);

    size_t nItems = tr_config->List(10, &configItems[0]);
    TR_ASSERT(t, nItems == 5);

    for(int i=0;i<(int)nItems;i++) {
        printf("%d:%s = ", i, configItems[i].name);
        switch(configItems[i].value_type) {
            case kTRCfgType_Str :
                printf("%s", configItems[i].value.str);
                break;
            case kTRCfgType_Bool :
                printf("%s", (configItems[i].value.boolean)?"true":"false");
                break;
            case kTRCfgType_Num :
                printf("%d", configItems[i].value.num);
                break;
        }
        printf("\n");
    }

    size_t nItems2 = tr_config->List(2, &configItems[0]);
    TR_ASSERT(t, nItems2 == 2);

    return kTR_Pass;
}